

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::stringarg::test_method(stringarg *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar2;
  pair<const_char_*,_ArgsManager::Flags> bar;
  pair<const_char_*,_ArgsManager::Flags> foo;
  ArgsManager local_args;
  char *in_stack_fffffffffffff298;
  lazy_ostream *in_stack_fffffffffffff2a0;
  char *in_stack_fffffffffffff2a8;
  char (*in_stack_fffffffffffff2b0) [5];
  const_string *in_stack_fffffffffffff2c0;
  string *in_stack_fffffffffffff2c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff2d0;
  ArgsManager *in_stack_fffffffffffff2d8;
  ArgsManager *in_stack_fffffffffffff2e0;
  undefined7 in_stack_fffffffffffff2e8;
  undefined1 in_stack_fffffffffffff2ef;
  string *in_stack_fffffffffffff320;
  ArgsManager *in_stack_fffffffffffff328;
  undefined1 *local_b50;
  allocator<char> local_ada;
  allocator<char> local_ad9;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [70];
  allocator<char> local_a82;
  allocator<char> local_a81;
  undefined1 local_a80 [16];
  undefined1 local_a70 [69];
  allocator<char> local_a2b;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  undefined1 local_a28 [16];
  undefined1 local_a18 [70];
  allocator<char> local_9d2;
  allocator<char> local_9d1;
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [69];
  allocator<char> local_97b;
  allocator<char> local_97a;
  allocator<char> local_979;
  undefined1 local_978 [16];
  undefined1 local_968 [70];
  allocator<char> local_922;
  allocator<char> local_921;
  undefined1 local_920 [16];
  undefined1 local_910 [69];
  allocator<char> local_8cb;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [70];
  allocator<char> local_872;
  allocator<char> local_871;
  undefined1 local_870 [16];
  undefined1 local_860 [69];
  allocator<char> local_81b;
  allocator<char> local_81a;
  allocator<char> local_819;
  undefined1 local_818 [16];
  undefined1 local_808 [70];
  allocator<char> local_7c2;
  allocator<char> local_7c1;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [70];
  allocator<char> local_76a [26];
  char *local_750;
  Flags local_748;
  undefined4 local_73c;
  char *local_738;
  Flags local_730;
  undefined4 local_724;
  char *local_720;
  Flags local_718;
  char *local_710;
  Flags local_708;
  undefined1 local_6c0 [96];
  undefined1 local_660 [128];
  undefined1 local_5e0 [96];
  undefined1 local_580 [128];
  undefined1 local_500 [96];
  undefined1 local_4a0 [128];
  undefined1 local_420 [96];
  undefined1 local_3c0 [128];
  undefined1 local_340 [96];
  undefined1 local_2e0 [64];
  undefined1 local_2a0 [80];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_fffffffffffff298);
  local_724 = 1;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff2b0,(Flags *)in_stack_fffffffffffff2a8);
  local_738 = pVar2.first;
  local_730 = pVar2.second;
  local_73c = 1;
  local_710 = local_738;
  local_708 = local_730;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff2b0,(Flags *)in_stack_fffffffffffff2a8);
  local_750 = pVar2.first;
  local_748 = pVar2.second;
  local_720 = local_750;
  local_718 = local_748;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff2d0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff2c8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff2d0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff2c8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff298);
  __l._M_len._0_7_ = in_stack_fffffffffffff2e8;
  __l._M_array = (iterator)in_stack_fffffffffffff2e0;
  __l._M_len._7_1_ = in_stack_fffffffffffff2ef;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_fffffffffffff2d8,__l,(allocator_type *)in_stack_fffffffffffff2d0);
  SetupArgs(in_stack_fffffffffffff2e0,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff2d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff2a8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff298);
  local_b50 = local_250;
  do {
    local_b50 = local_b50 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffff298);
  } while (local_b50 != local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
             (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
  ResetArgs(in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298);
  std::allocator<char>::~allocator(local_76a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_7b0,local_7c0,0xdf,1,2,local_2e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_7c2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_7c1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"eleven\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1bf3a3a;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"eleven\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_808,local_818,0xe0,1,2,local_340);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_81a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_819);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
             (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
  ResetArgs(in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298);
  std::allocator<char>::~allocator(&local_81b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_860,local_870,0xe3,1,2,local_3c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_872);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_871);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"eleven\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_8b8,local_8c8,0xe4,1,2,local_420);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_8ca);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_8c9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
             (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
  ResetArgs(in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298);
  std::allocator<char>::~allocator(&local_8cb);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_910,local_920,0xe7,1,2,local_4a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_922);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_921);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"eleven\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_968,local_978,0xe8,1,2,local_500);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_97a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_979);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
             (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
  ResetArgs(in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298);
  std::allocator<char>::~allocator(&local_97b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"11\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1bfc2fa;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_9c0,local_9d0,0xeb,1,2,local_580);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_9d2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_9d1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"11\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1bfc2fa;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"eleven\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_a18,local_a28,0xec,1,2,local_5e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_a2a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_a29);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
             (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
  ResetArgs(in_stack_fffffffffffff328,in_stack_fffffffffffff320);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298);
  std::allocator<char>::~allocator(&local_a2b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"eleven\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1bf3a3a;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_a70,local_a80,0xef,1,2,local_660);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_a82);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_a81);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8,
               (const_string *)in_stack_fffffffffffff2d0,(size_t)in_stack_fffffffffffff2c8,
               in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff2ef,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    ArgsManager::GetArg(in_stack_fffffffffffff2d8,&in_stack_fffffffffffff2d0->first,
                        in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2a8 = "\"eleven\"";
    in_stack_fffffffffffff2a0 = (lazy_ostream *)0x1bf3a3a;
    in_stack_fffffffffffff298 = "local_args.GetArg(\"-foo\", \"eleven\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_ac8,local_ad8,0xf0,1,2,local_6c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_ada);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_ad9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    in_stack_fffffffffffff2ef = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff2ef);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_fffffffffffff298);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(stringarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");

    ResetArgs(local_args, "-foo -bar");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "11");

    ResetArgs(local_args, "-foo=eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");
}